

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

IdentifierNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IdentifierNameSyntax,slang::syntax::IdentifierNameSyntax_const&>
          (BumpAllocator *this,IdentifierNameSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  IdentifierNameSyntax *pIVar8;
  
  pIVar8 = (IdentifierNameSyntax *)allocate(this,0x28,8);
  uVar3 = *(undefined4 *)&(args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  pSVar2 = (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  TVar4 = (args->identifier).kind;
  uVar5 = (args->identifier).field_0x2;
  NVar6.raw = (args->identifier).numFlags.raw;
  uVar7 = (args->identifier).rawLen;
  (pIVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar3;
  (pIVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  (pIVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode = pSVar2;
  (pIVar8->identifier).kind = TVar4;
  (pIVar8->identifier).field_0x2 = uVar5;
  (pIVar8->identifier).numFlags = (NumericTokenFlags)NVar6.raw;
  (pIVar8->identifier).rawLen = uVar7;
  (pIVar8->identifier).info = (args->identifier).info;
  return pIVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }